

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_avx2.c
# Opt level: O3

void av1_build_compound_diffwtd_mask_avx2
               (uint8_t *mask,DIFFWTD_MASK_TYPE mask_type,uint8_t *src0,int src0_stride,
               uint8_t *src1,int src1_stride,int h,int w)

{
  short sVar1;
  long lVar2;
  undefined7 in_register_00000031;
  int iVar3;
  int j;
  int iVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  sVar1 = (ushort)((int)CONCAT71(in_register_00000031,mask_type) != 1) * 0x40 + -0x1a;
  auVar7._2_2_ = sVar1;
  auVar7._0_2_ = sVar1;
  auVar7._4_2_ = sVar1;
  auVar7._6_2_ = sVar1;
  auVar7._8_2_ = sVar1;
  auVar7._10_2_ = sVar1;
  auVar7._12_2_ = sVar1;
  auVar7._14_2_ = sVar1;
  auVar7._16_2_ = sVar1;
  auVar7._18_2_ = sVar1;
  auVar7._20_2_ = sVar1;
  auVar7._22_2_ = sVar1;
  auVar7._24_2_ = sVar1;
  auVar7._26_2_ = sVar1;
  auVar7._28_2_ = sVar1;
  auVar7._30_2_ = sVar1;
  lVar2 = (long)src0_stride;
  if (w == 4) {
    lVar5 = (long)src1_stride;
    lVar6 = 0;
    do {
      auVar8 = vpinsrd_avx(ZEXT416(*(uint *)src0),*(undefined4 *)((long)src0 + lVar2),1);
      auVar10 = vpinsrd_avx(ZEXT416(*(uint *)((long)src0 + lVar2 * 2)),
                            *(undefined4 *)((long)src0 + lVar2 * 3),1);
      auVar11 = vpinsrd_avx(ZEXT416(*(uint *)src1),*(undefined4 *)((long)src1 + lVar5),1);
      auVar13 = vpinsrd_avx(ZEXT416(*(uint *)((long)src1 + lVar5 * 2)),
                            *(undefined4 *)((long)src1 + lVar5 * 3),1);
      auVar8 = vpunpcklqdq_avx(auVar8,auVar10);
      auVar11 = vpunpcklqdq_avx(auVar11,auVar13);
      auVar10 = vpminub_avx(auVar8,auVar11);
      auVar8 = vpmaxub_avx(auVar8,auVar11);
      auVar8 = vpsubb_avx(auVar8,auVar10);
      auVar9 = vpmovzxbw_avx2(auVar8);
      auVar9 = vpsrlw_avx2(auVar9,4);
      auVar9 = vpaddw_avx2(auVar9,auVar7);
      auVar9 = vpabsw_avx2(auVar9);
      auVar8 = vpackuswb_avx(auVar9._0_16_,auVar9._16_16_);
      *(undefined1 (*) [16])(mask + lVar6 * 4) = auVar8;
      src0 = (uint8_t *)((long)src0 + (long)(src0_stride << 2));
      src1 = (uint8_t *)((long)src1 + (long)(src1_stride << 2));
      lVar6 = lVar6 + 4;
    } while ((int)lVar6 < h);
  }
  else if (w == 8) {
    lVar5 = (long)src1_stride;
    lVar6 = 0;
    do {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)((long)src0 + lVar2 * 2);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = *(ulong *)src0;
      auVar8 = vpunpcklqdq_avx(auVar10,auVar8);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = *(ulong *)((long)src0 + lVar2 * 3);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = *(ulong *)((long)src0 + lVar2);
      auVar11 = vpunpcklqdq_avx(auVar13,auVar11);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = *(ulong *)((long)src1 + lVar5 * 2);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = *(ulong *)src1;
      auVar13 = vpunpcklqdq_avx(auVar15,auVar14);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = *(ulong *)((long)src1 + lVar5 * 3);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = *(ulong *)((long)src1 + lVar5);
      auVar14 = vpunpcklqdq_avx(auVar17,auVar16);
      auVar10 = vpminub_avx(auVar8,auVar13);
      auVar8 = vpmaxub_avx(auVar8,auVar13);
      auVar8 = vpsubb_avx(auVar8,auVar10);
      auVar9 = vpmovzxbw_avx2(auVar8);
      auVar9 = vpsrlw_avx2(auVar9,4);
      auVar9 = vpaddw_avx2(auVar9,auVar7);
      auVar9 = vpabsw_avx2(auVar9);
      auVar10 = vpminub_avx(auVar11,auVar14);
      auVar8 = vpmaxub_avx(auVar11,auVar14);
      auVar8 = vpsubb_avx(auVar8,auVar10);
      auVar12 = vpmovzxbw_avx2(auVar8);
      auVar12 = vpsrlw_avx2(auVar12,4);
      auVar12 = vpaddw_avx2(auVar12,auVar7);
      auVar12 = vpabsw_avx2(auVar12);
      auVar9 = vpackuswb_avx2(auVar9,auVar12);
      *(undefined1 (*) [32])(mask + lVar6 * 8) = auVar9;
      src0 = (uint8_t *)((long)src0 + (long)(src0_stride << 2));
      src1 = (uint8_t *)((long)src1 + (long)(src1_stride << 2));
      lVar6 = lVar6 + 4;
    } while ((int)lVar6 < h);
  }
  else if (w == 0x10) {
    iVar4 = 0;
    do {
      auVar10 = vpminub_avx(*(undefined1 (*) [16])src0,*(undefined1 (*) [16])src1);
      auVar8 = vpmaxub_avx(*(undefined1 (*) [16])src0,*(undefined1 (*) [16])src1);
      auVar8 = vpsubb_avx(auVar8,auVar10);
      auVar9 = vpmovzxbw_avx2(auVar8);
      auVar9 = vpsrlw_avx2(auVar9,4);
      auVar9 = vpaddw_avx2(auVar9,auVar7);
      auVar9 = vpabsw_avx2(auVar9);
      auVar10 = vpminub_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])src0 + lVar2),
                            *(undefined1 (*) [16])(*(undefined1 (*) [16])src1 + src1_stride));
      auVar8 = vpmaxub_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])src0 + lVar2),
                           *(undefined1 (*) [16])(*(undefined1 (*) [16])src1 + src1_stride));
      auVar8 = vpsubb_avx(auVar8,auVar10);
      auVar12 = vpmovzxbw_avx2(auVar8);
      auVar12 = vpsrlw_avx2(auVar12,4);
      auVar12 = vpaddw_avx2(auVar12,auVar7);
      auVar12 = vpabsw_avx2(auVar12);
      auVar9 = vpackuswb_avx2(auVar9,auVar12);
      auVar9 = vpermq_avx2(auVar9,0xd8);
      *(undefined1 (*) [32])mask = auVar9;
      src0 = *(undefined1 (*) [16])src0 + src0_stride * 2;
      src1 = *(undefined1 (*) [16])src1 + src1_stride * 2;
      mask = (uint8_t *)((long)mask + 0x20);
      iVar4 = iVar4 + 2;
    } while (iVar4 < h);
  }
  else {
    iVar4 = 1;
    if (1 < h) {
      iVar4 = h;
    }
    iVar3 = 0;
    do {
      lVar5 = 0;
      do {
        auVar10 = vpminub_avx(*(undefined1 (*) [16])(src0 + lVar5),
                              *(undefined1 (*) [16])(src1 + lVar5));
        auVar8 = vpmaxub_avx(*(undefined1 (*) [16])(src0 + lVar5),
                             *(undefined1 (*) [16])(src1 + lVar5));
        auVar8 = vpsubb_avx(auVar8,auVar10);
        auVar9 = vpmovzxbw_avx2(auVar8);
        auVar9 = vpsrlw_avx2(auVar9,4);
        auVar9 = vpaddw_avx2(auVar9,auVar7);
        auVar9 = vpabsw_avx2(auVar9);
        auVar10 = vpminub_avx(*(undefined1 (*) [16])(src0 + lVar5 + 0x10),
                              *(undefined1 (*) [16])(src1 + lVar5 + 0x10));
        auVar8 = vpmaxub_avx(*(undefined1 (*) [16])(src0 + lVar5 + 0x10),
                             *(undefined1 (*) [16])(src1 + lVar5 + 0x10));
        auVar8 = vpsubb_avx(auVar8,auVar10);
        auVar12 = vpmovzxbw_avx2(auVar8);
        auVar12 = vpsrlw_avx2(auVar12,4);
        auVar12 = vpaddw_avx2(auVar12,auVar7);
        auVar12 = vpabsw_avx2(auVar12);
        auVar9 = vpackuswb_avx2(auVar9,auVar12);
        auVar9 = vpermq_avx2(auVar9,0xd8);
        *(undefined1 (*) [32])(mask + lVar5) = auVar9;
        lVar5 = lVar5 + 0x20;
      } while (lVar5 < w);
      src0 = src0 + lVar2;
      src1 = src1 + src1_stride;
      mask = mask + w;
      iVar3 = iVar3 + 1;
    } while (iVar3 != iVar4);
  }
  return;
}

Assistant:

void av1_build_compound_diffwtd_mask_avx2(uint8_t *mask,
                                          DIFFWTD_MASK_TYPE mask_type,
                                          const uint8_t *src0, int src0_stride,
                                          const uint8_t *src1, int src1_stride,
                                          int h, int w) {
  const int mb = (mask_type == DIFFWTD_38_INV) ? AOM_BLEND_A64_MAX_ALPHA : 0;
  const __m256i y_mask_base = _mm256_set1_epi16(38 - mb);
  int i = 0;
  if (4 == w) {
    do {
      const __m128i s0A = xx_loadl_32(src0);
      const __m128i s0B = xx_loadl_32(src0 + src0_stride);
      const __m128i s0C = xx_loadl_32(src0 + src0_stride * 2);
      const __m128i s0D = xx_loadl_32(src0 + src0_stride * 3);
      const __m128i s0AB = _mm_unpacklo_epi32(s0A, s0B);
      const __m128i s0CD = _mm_unpacklo_epi32(s0C, s0D);
      const __m128i s0ABCD = _mm_unpacklo_epi64(s0AB, s0CD);
      const __m256i s0ABCD_w = _mm256_cvtepu8_epi16(s0ABCD);

      const __m128i s1A = xx_loadl_32(src1);
      const __m128i s1B = xx_loadl_32(src1 + src1_stride);
      const __m128i s1C = xx_loadl_32(src1 + src1_stride * 2);
      const __m128i s1D = xx_loadl_32(src1 + src1_stride * 3);
      const __m128i s1AB = _mm_unpacklo_epi32(s1A, s1B);
      const __m128i s1CD = _mm_unpacklo_epi32(s1C, s1D);
      const __m128i s1ABCD = _mm_unpacklo_epi64(s1AB, s1CD);
      const __m256i s1ABCD_w = _mm256_cvtepu8_epi16(s1ABCD);
      const __m256i m16 = calc_mask_avx2(y_mask_base, s0ABCD_w, s1ABCD_w);
      const __m256i m8 = _mm256_packus_epi16(m16, _mm256_setzero_si256());
      const __m128i x_m8 =
          _mm256_castsi256_si128(_mm256_permute4x64_epi64(m8, 0xd8));
      xx_storeu_128(mask, x_m8);
      src0 += (src0_stride << 2);
      src1 += (src1_stride << 2);
      mask += 16;
      i += 4;
    } while (i < h);
  } else if (8 == w) {
    do {
      const __m128i s0A = xx_loadl_64(src0);
      const __m128i s0B = xx_loadl_64(src0 + src0_stride);
      const __m128i s0C = xx_loadl_64(src0 + src0_stride * 2);
      const __m128i s0D = xx_loadl_64(src0 + src0_stride * 3);
      const __m256i s0AC_w = _mm256_cvtepu8_epi16(_mm_unpacklo_epi64(s0A, s0C));
      const __m256i s0BD_w = _mm256_cvtepu8_epi16(_mm_unpacklo_epi64(s0B, s0D));
      const __m128i s1A = xx_loadl_64(src1);
      const __m128i s1B = xx_loadl_64(src1 + src1_stride);
      const __m128i s1C = xx_loadl_64(src1 + src1_stride * 2);
      const __m128i s1D = xx_loadl_64(src1 + src1_stride * 3);
      const __m256i s1AB_w = _mm256_cvtepu8_epi16(_mm_unpacklo_epi64(s1A, s1C));
      const __m256i s1CD_w = _mm256_cvtepu8_epi16(_mm_unpacklo_epi64(s1B, s1D));
      const __m256i m16AC = calc_mask_avx2(y_mask_base, s0AC_w, s1AB_w);
      const __m256i m16BD = calc_mask_avx2(y_mask_base, s0BD_w, s1CD_w);
      const __m256i m8 = _mm256_packus_epi16(m16AC, m16BD);
      yy_storeu_256(mask, m8);
      src0 += src0_stride << 2;
      src1 += src1_stride << 2;
      mask += 32;
      i += 4;
    } while (i < h);
  } else if (16 == w) {
    do {
      const __m128i s0A = xx_load_128(src0);
      const __m128i s0B = xx_load_128(src0 + src0_stride);
      const __m128i s1A = xx_load_128(src1);
      const __m128i s1B = xx_load_128(src1 + src1_stride);
      const __m256i s0AL = _mm256_cvtepu8_epi16(s0A);
      const __m256i s0BL = _mm256_cvtepu8_epi16(s0B);
      const __m256i s1AL = _mm256_cvtepu8_epi16(s1A);
      const __m256i s1BL = _mm256_cvtepu8_epi16(s1B);

      const __m256i m16AL = calc_mask_avx2(y_mask_base, s0AL, s1AL);
      const __m256i m16BL = calc_mask_avx2(y_mask_base, s0BL, s1BL);

      const __m256i m8 =
          _mm256_permute4x64_epi64(_mm256_packus_epi16(m16AL, m16BL), 0xd8);
      yy_storeu_256(mask, m8);
      src0 += src0_stride << 1;
      src1 += src1_stride << 1;
      mask += 32;
      i += 2;
    } while (i < h);
  } else {
    do {
      int j = 0;
      do {
        const __m256i s0 = yy_loadu_256(src0 + j);
        const __m256i s1 = yy_loadu_256(src1 + j);
        const __m256i s0L = _mm256_cvtepu8_epi16(_mm256_castsi256_si128(s0));
        const __m256i s1L = _mm256_cvtepu8_epi16(_mm256_castsi256_si128(s1));
        const __m256i s0H =
            _mm256_cvtepu8_epi16(_mm256_extracti128_si256(s0, 1));
        const __m256i s1H =
            _mm256_cvtepu8_epi16(_mm256_extracti128_si256(s1, 1));
        const __m256i m16L = calc_mask_avx2(y_mask_base, s0L, s1L);
        const __m256i m16H = calc_mask_avx2(y_mask_base, s0H, s1H);
        const __m256i m8 =
            _mm256_permute4x64_epi64(_mm256_packus_epi16(m16L, m16H), 0xd8);
        yy_storeu_256(mask + j, m8);
        j += 32;
      } while (j < w);
      src0 += src0_stride;
      src1 += src1_stride;
      mask += w;
      i += 1;
    } while (i < h);
  }
}